

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_stop_sending_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  int iVar1;
  int err;
  int ret;
  quicly_stream_t *stream;
  quicly_stop_sending_frame_t frame;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  quicly_stream_t *in_stack_ffffffffffffffd0;
  uint8_t **in_stack_ffffffffffffffd8;
  ushort local_20;
  int local_4;
  
  local_4 = quicly_decode_stop_sending_frame
                      (in_stack_ffffffffffffffd8,(uint8_t *)in_stack_ffffffffffffffd0,
                       (quicly_stop_sending_frame_t *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (((local_4 == 0) &&
      (local_4 = quicly_get_or_open_stream((quicly_conn_t *)frame.stream_id,(uint64_t)stream,_err),
      local_4 == 0)) && (in_stack_ffffffffffffffd0 != (quicly_stream_t *)0x0)) {
    iVar1 = quicly_sendstate_is_open(&in_stack_ffffffffffffffd0->sendstate);
    if (iVar1 != 0) {
      iVar1 = local_20 + 0x30000;
      quicly_reset_stream(in_stack_ffffffffffffffd0,local_4);
      (*in_stack_ffffffffffffffd0->callbacks->on_send_stop)(in_stack_ffffffffffffffd0,iVar1);
      if (QUICLY_STATE_CONNECTED < (in_stack_ffffffffffffffd0->conn->super).state) {
        return 0xff06;
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int handle_stop_sending_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_stop_sending_frame_t frame;
    quicly_stream_t *stream;
    int ret;

    if ((ret = quicly_decode_stop_sending_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    if ((ret = quicly_get_or_open_stream(conn, frame.stream_id, &stream)) != 0 || stream == NULL)
        return ret;

    if (quicly_sendstate_is_open(&stream->sendstate)) {
        /* reset the stream, then notify the application */
        int err = QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(frame.app_error_code);
        quicly_reset_stream(stream, err);
        QUICLY_PROBE(STREAM_ON_SEND_STOP, stream->conn, stream->conn->stash.now, stream, err);
        stream->callbacks->on_send_stop(stream, err);
        if (stream->conn->super.state >= QUICLY_STATE_CLOSING)
            return QUICLY_ERROR_IS_CLOSING;
    }

    return 0;
}